

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_hash.c
# Opt level: O1

int fiobj_hash_haskey(FIOBJ hash,FIOBJ key)

{
  uint uVar1;
  uint64_t hash_value;
  fio_hash____map_s_ *pfVar2;
  FIOBJ in_RCX;
  fio_hash___couplet_s obj;
  
  if (((uint)hash & 7) == 4) {
    hash_value = fiobj_obj2hash(key);
    obj.obj = in_RCX;
    obj.key = key;
    pfVar2 = fio_hash____find_map_pos_
                       ((fio_hash___s *)((hash & 0xfffffffffffffff8) + 8),hash_value,obj);
    uVar1 = 0;
    if ((pfVar2 != (fio_hash____map_s_ *)0x0) && (pfVar2->pos != (fio_hash____ordered_s_ *)0x0)) {
      uVar1 = (uint)((pfVar2->pos->obj).obj != 0);
    }
    return uVar1;
  }
  __assert_fail("hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_hash.c"
                ,0x141,"int fiobj_hash_haskey(const FIOBJ, FIOBJ)");
}

Assistant:

int fiobj_hash_haskey(const FIOBJ hash, FIOBJ key) {
  assert(hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH));
  return fio_hash___find(&obj2hash(hash)->hash, fiobj_obj2hash(key), key) !=
         FIOBJ_INVALID;
}